

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__udp_bind(uv_udp_t *handle,sockaddr *addr,uint addrlen,uint flags)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  int __level;
  undefined4 local_30;
  int yes;
  
  if ((flags & 0xffffffda) != 0) {
    return -0x16;
  }
  if (((flags & 1) != 0) && (addr->sa_family != 10)) {
    return -0x16;
  }
  iVar1 = (handle->io_watcher).fd;
  if (iVar1 == -1) {
    iVar1 = uv__socket((uint)addr->sa_family,2,0);
    if (iVar1 < 0) {
      return iVar1;
    }
    (handle->io_watcher).fd = iVar1;
  }
  if (0x1f < flags) {
    local_30 = 1;
    if (addr->sa_family == 10) {
      __level = 0x29;
      iVar2 = 0x19;
    }
    else {
      if (addr->sa_family != 2) goto LAB_00140b56;
      iVar2 = 0xb;
      __level = 0;
    }
    iVar2 = setsockopt(iVar1,__level,iVar2,&local_30,4);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        return -*piVar3;
      }
    }
  }
LAB_00140b56:
  if (((flags & 4) == 0) || (iVar2 = uv__set_reuse(iVar1), iVar2 == 0)) {
    if ((flags & 1) != 0) {
      yes = 1;
      iVar2 = setsockopt(iVar1,0x29,0x1a,&yes,4);
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        return -*piVar3;
      }
    }
    iVar1 = bind(iVar1,(sockaddr *)addr,addrlen);
    if (iVar1 == 0) {
      uVar4 = handle->flags | 0x400000;
      if (addr->sa_family != 10) {
        uVar4 = handle->flags;
      }
      handle->flags = uVar4 | 0x2000;
      iVar2 = 0;
    }
    else {
      piVar3 = __errno_location();
      iVar2 = -0x16;
      if (*piVar3 != 0x61) {
        iVar2 = -*piVar3;
      }
    }
  }
  return iVar2;
}

Assistant:

int uv__udp_bind(uv_udp_t* handle,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 unsigned int flags) {
  int err;
  int yes;
  int fd;

  /* Check for bad flags. */
  if (flags & ~(UV_UDP_IPV6ONLY | UV_UDP_REUSEADDR | UV_UDP_LINUX_RECVERR))
    return UV_EINVAL;

  /* Cannot set IPv6-only mode on non-IPv6 socket. */
  if ((flags & UV_UDP_IPV6ONLY) && addr->sa_family != AF_INET6)
    return UV_EINVAL;

  fd = handle->io_watcher.fd;
  if (fd == -1) {
    err = uv__socket(addr->sa_family, SOCK_DGRAM, 0);
    if (err < 0)
      return err;
    fd = err;
    handle->io_watcher.fd = fd;
  }

  if (flags & UV_UDP_LINUX_RECVERR) {
    err = uv__set_recverr(fd, addr->sa_family);
    if (err)
      return err;
  }

  if (flags & UV_UDP_REUSEADDR) {
    err = uv__set_reuse(fd);
    if (err)
      return err;
  }

  if (flags & UV_UDP_IPV6ONLY) {
#ifdef IPV6_V6ONLY
    yes = 1;
    if (setsockopt(fd, IPPROTO_IPV6, IPV6_V6ONLY, &yes, sizeof yes) == -1) {
      err = UV__ERR(errno);
      return err;
    }
#else
    err = UV_ENOTSUP;
    return err;
#endif
  }

  if (bind(fd, addr, addrlen)) {
    err = UV__ERR(errno);
    if (errno == EAFNOSUPPORT)
      /* OSX, other BSDs and SunoS fail with EAFNOSUPPORT when binding a
       * socket created with AF_INET to an AF_INET6 address or vice versa. */
      err = UV_EINVAL;
    return err;
  }

  if (addr->sa_family == AF_INET6)
    handle->flags |= UV_HANDLE_IPV6;

  handle->flags |= UV_HANDLE_BOUND;
  return 0;
}